

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul.c
# Opt level: O0

short gai_get_task_list(task_list_t *taskListA,task_list_t *taskListB,task_list_t *state,
                       Integer istart,Integer jstart,Integer kstart,Integer iend,Integer jend,
                       Integer kend,Integer Ichunk,Integer Jchunk,Integer Kchunk,int *max_tasks,
                       Integer g_a)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  Integer IVar4;
  int iVar5;
  int iVar6;
  long in_RCX;
  int *in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  bool bVar7;
  long in_stack_00000008;
  long in_stack_00000010;
  long in_stack_00000018;
  long in_stack_00000020;
  long in_stack_00000028;
  Integer a_grp;
  int grp_me;
  int offset;
  int pcol;
  int prow;
  Integer kstart_;
  Integer jstart_;
  Integer get_new_B;
  Integer khi;
  Integer klo;
  Integer jhi;
  Integer jlo;
  Integer ihi;
  Integer ilo;
  short recovery;
  short more_chunks_left;
  short do_put;
  int nloops;
  int jj;
  int ii;
  int local_c8;
  int local_c0;
  int local_b8;
  long local_90;
  long local_88;
  long local_70;
  long local_60;
  long local_50;
  short local_40;
  undefined2 local_3e;
  int local_38;
  int local_34;
  
  local_40 = 0;
  bVar7 = *in_RDX != -1;
  iVar3 = (int)(((in_stack_00000008 - in_RCX) + 1) / in_stack_00000020) +
          (uint)(((in_stack_00000008 - in_RCX) + 1) % in_stack_00000020 != 0);
  if (0x400 < iVar3) {
    pnga_error((char *)taskListA,(Integer)taskListB);
  }
  local_88 = in_R8;
  if (bVar7) {
    local_88 = (long)*in_RDX;
  }
  local_38 = 0;
  local_34 = 0;
  local_90 = in_R9;
  for (local_60 = local_88; local_60 <= in_stack_00000010; local_60 = in_stack_00000028 + local_60)
  {
    iVar5 = (int)local_60;
    if (local_60 + in_stack_00000028 + -1 < in_stack_00000010) {
      local_b8 = iVar5 + (int)in_stack_00000028 + -1;
    }
    else {
      local_b8 = (int)in_stack_00000010;
    }
    if (bVar7) {
      local_3e = (undefined2)in_RDX[7];
      local_90 = (long)in_RDX[1];
    }
    else {
      local_3e = 1;
    }
    for (local_70 = local_90; local_70 <= in_stack_00000018; local_70 = a_grp + local_70) {
      iVar6 = (int)local_70;
      if (local_70 + a_grp + -1 < in_stack_00000018) {
        local_c0 = iVar6 + (int)a_grp + -1;
      }
      else {
        local_c0 = (int)in_stack_00000018;
      }
      bVar2 = true;
      bVar7 = false;
      local_50 = in_RCX;
      if (0x3ff < local_34 + iVar3) {
        local_40 = 1;
        *in_RDX = iVar5;
        in_RDX[1] = iVar6;
        *(undefined2 *)(in_RDX + 7) = local_3e;
        local_90 = in_R9;
        break;
      }
      for (; local_50 <= in_stack_00000008; local_50 = in_stack_00000020 + local_50) {
        iVar1 = (int)local_50;
        if (local_50 + in_stack_00000020 + -1 < in_stack_00000008) {
          local_c8 = iVar1 + (int)in_stack_00000020 + -1;
        }
        else {
          local_c8 = (int)in_stack_00000008;
        }
        *(int *)(in_RDI + (long)local_34 * 0x20 + 0x10) = (local_c8 - iVar1) + 1;
        *(int *)(in_RDI + (long)local_34 * 0x20 + 0x14) = (local_c0 - iVar6) + 1;
        *(int *)(in_RDI + (long)local_34 * 0x20) = iVar1;
        *(int *)(in_RDI + (long)local_34 * 0x20 + 8) = local_c8;
        *(int *)(in_RDI + (long)local_34 * 0x20 + 4) = iVar6;
        *(int *)(in_RDI + (long)local_34 * 0x20 + 0xc) = local_c0;
        *(undefined2 *)(in_RDI + (long)local_34 * 0x20 + 0x1c) = local_3e;
        if (bVar2) {
          *(int *)(in_RSI + (long)local_38 * 0x20 + 0x10) = (local_c0 - iVar6) + 1;
          *(int *)(in_RSI + (long)local_38 * 0x20 + 0x14) = (local_b8 - iVar5) + 1;
          *(int *)(in_RSI + (long)local_38 * 0x20) = iVar6;
          *(int *)(in_RSI + (long)local_38 * 0x20 + 8) = local_c0;
          *(int *)(in_RSI + (long)local_38 * 0x20 + 4) = iVar5;
          *(int *)(in_RSI + (long)local_38 * 0x20 + 0xc) = local_b8;
          bVar2 = false;
          *(int *)(in_RDI + (long)local_34 * 0x20 + 0x18) = local_38;
          local_38 = local_38 + 1;
        }
        else {
          *(undefined4 *)(in_RDI + (long)local_34 * 0x20 + 0x18) =
               *(undefined4 *)(in_RDI + (long)(local_34 + -1) * 0x20 + 0x18);
        }
        local_34 = local_34 + 1;
      }
      local_90 = in_R9;
      if (local_40 != 0) break;
      local_3e = 0;
    }
    if (local_40 != 0) break;
  }
  *_grp_me = local_34;
  if (local_40 != 0) {
    CYCLIC_DISTR_OPT_FLAG = 0;
  }
  if (CYCLIC_DISTR_OPT_FLAG != 0) {
    IVar4 = pnga_get_pgroup(_pcol);
    IVar4 = pnga_pgroup_nodeid(IVar4);
    iVar3 = GA[_pcol + 1000].nblock[0];
    iVar5 = GA[_pcol + 1000].nblock[1];
    local_38 = 0;
    for (local_50 = in_RCX; local_50 <= in_stack_00000008; local_50 = in_stack_00000020 + local_50)
    {
      *(undefined2 *)(in_RDI + (long)local_38 * 0x20 + 0x1c) = 0;
      local_38 = local_38 + 1;
    }
    local_38 = 0;
    for (local_50 = in_RCX; local_50 <= in_stack_00000008; local_50 = in_stack_00000020 + local_50)
    {
      *(undefined2 *)
       (in_RDI + (long)(local_38 + ((int)IVar4 / iVar3 + (int)IVar4 % iVar3) % iVar5) * 0x20 + 0x1c)
           = 1;
      local_38 = local_38 + 1;
    }
  }
  return local_40;
}

Assistant:

static short int
gai_get_task_list(task_list_t *taskListA, task_list_t *taskListB, 
		  task_list_t *state, Integer istart, Integer jstart,
		  Integer kstart, Integer iend, Integer jend, Integer kend, 
		  Integer Ichunk, Integer Jchunk, Integer Kchunk, 
		  int *max_tasks, Integer g_a) {
    
    int ii, jj, nloops=0;
    short int do_put, more_chunks_left=0, recovery=0;
    Integer ilo, ihi, jlo, jhi, klo, khi, get_new_B;
    Integer jstart_=jstart, kstart_=kstart;
    
    if(state->lo[0] != -1) recovery = 1;

    nloops = (iend-istart+1)/Ichunk + ( ((iend-istart+1)%Ichunk)?1:0 );
    if(nloops>MAX_CHUNKS) pnga_error("Increase MAX_CHUNKS value in matmul.h",0L);

    if(recovery) jstart_ = state->lo[0]; /* recovering the previous state */
    for(ii=jj=0, jlo = jstart_; jlo <= jend; jlo += Jchunk) {
       jhi = GA_MIN(jend, jlo+Jchunk-1);

       if(recovery) {
	  do_put = state->do_put;
	  kstart_ =  state->lo[1];
       }
       else do_put = SET; /* for 1st shot we can put, instead of accumulate */
       
       for(klo = kstart_; klo <= kend; klo += Kchunk) {
	  khi = GA_MIN(kend, klo+Kchunk-1); 
	  get_new_B = TRUE;
	  
	  /* set it back after the first loop */
	  recovery = 0;
	  jstart_ = jstart;
	  kstart_ = kstart;
	  
	  /* save CURRENT STATE. Saving state before "i" loop helps to avoid 
	     tracking get_new_B, which is hassle in ga_matmul_regular() */
	  if(ii+nloops >= MAX_CHUNKS) {
	     more_chunks_left = 1;
	     state->lo[0]  = jlo;
	     state->lo[1]  = klo;
	     state->do_put   = do_put;
	     break;
	  }
	  
	  for(ilo = istart; ilo <= iend; ilo += Ichunk){ 	     
	     ihi = GA_MIN(iend, ilo+Ichunk-1);
	     taskListA[ii].dim[0] = ihi - ilo + 1; 
	     taskListA[ii].dim[1] = khi - klo + 1;
	     taskListA[ii].lo[0]  = ilo; taskListA[ii].hi[0] = ihi;
	     taskListA[ii].lo[1]  = klo; taskListA[ii].hi[1] = khi;
	     taskListA[ii].do_put = do_put;
	     if(get_new_B) { /* B matrix */
		ihi = GA_MIN(iend, ilo+Ichunk-1);
		taskListB[jj].dim[0] = khi - klo + 1; 
		taskListB[jj].dim[1] = jhi - jlo + 1;
		taskListB[jj].lo[0]  = klo; taskListB[jj].hi[0] = khi;
		taskListB[jj].lo[1]  = jlo; taskListB[jj].hi[1] = jhi;
		get_new_B = FALSE; /* Until J or K change again */
		taskListA[ii].chunkBId = jj;
		++jj;
	     }
	     else taskListA[ii].chunkBId = taskListA[ii-1].chunkBId;
	     ++ii;
	  }
	  if (more_chunks_left) break;
	  do_put = UNSET;
       }
       if (more_chunks_left) break;
    }

    *max_tasks = ii;

    /* Optimization disabled if chunks exceeds buffer space */
    if(more_chunks_left) CYCLIC_DISTR_OPT_FLAG = UNSET;

    if(CYCLIC_DISTR_OPT_FLAG) { /* should not be called for irregular matmul */
       int prow, pcol, offset, grp_me;
       Integer a_grp = pnga_get_pgroup(g_a);
       grp_me = (int)pnga_pgroup_nodeid(a_grp);
       prow = GA[GA_OFFSET + g_a].nblock[0];
       pcol = GA[GA_OFFSET + g_a].nblock[1];
       offset = (grp_me/prow + grp_me%prow) % pcol;
       for(jj=0, ilo = istart; ilo <= iend; jj++, ilo += Ichunk)
	  taskListA[jj].do_put = UNSET;
       for(jj=0, ilo = istart; ilo <= iend; jj++, ilo += Ichunk)
	  taskListA[jj+offset].do_put = SET;
    }

    return more_chunks_left;
}